

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Model::set_allocated_nonmaximumsuppression
          (Model *this,NonMaximumSuppression *nonmaximumsuppression)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  NonMaximumSuppression *nonmaximumsuppression_local;
  Model *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_Type(this);
  if (nonmaximumsuppression != (NonMaximumSuppression *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&nonmaximumsuppression->super_MessageLite);
    message_arena = (Arena *)nonmaximumsuppression;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::NonMaximumSuppression>
                              (message_arena_00,nonmaximumsuppression,submessage_arena_00);
    }
    set_has_nonmaximumsuppression(this);
    (this->Type_).pipelineclassifier_ = (PipelineClassifier *)message_arena;
  }
  return;
}

Assistant:

void Model::set_allocated_nonmaximumsuppression(::CoreML::Specification::NonMaximumSuppression* nonmaximumsuppression) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (nonmaximumsuppression) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(nonmaximumsuppression));
    if (message_arena != submessage_arena) {
      nonmaximumsuppression = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, nonmaximumsuppression, submessage_arena);
    }
    set_has_nonmaximumsuppression();
    Type_.nonmaximumsuppression_ = nonmaximumsuppression;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.nonMaximumSuppression)
}